

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_namespace::translate
          (method_namespace *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  bool bVar1;
  int iVar2;
  element_type *ptr_00;
  undefined8 uVar3;
  statement_base *psVar4;
  const_reference pptVar5;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *this_00;
  statement_base **ptr;
  iterator __end1;
  iterator __begin1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  _Self *in_stack_fffffffffffffd78;
  compiler_type *in_stack_fffffffffffffd80;
  _Self *in_stack_fffffffffffffd88;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffffd90;
  context_t *c;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *block;
  token_base *tbp;
  statement_namespace *this_01;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  element_type *in_stack_fffffffffffffdf0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffdf8;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffffe00;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_fffffffffffffe38;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_fffffffffffffe40;
  allocator local_1a1;
  string local_1a0 [32];
  reference local_180;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**> local_158;
  undefined1 *local_138;
  undefined1 local_119 [33];
  context_t local_f8 [2];
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_d8;
  undefined1 local_68 [104];
  
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x1b443c);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b4449);
  ptr_00 = std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b4451);
  c = local_f8;
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::begin((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)in_stack_fffffffffffffd78);
  block = &local_d8;
  std::operator+(in_stack_fffffffffffffd88,(difference_type)in_stack_fffffffffffffd80);
  tbp = (token_base *)(local_119 + 1);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::end((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         *)in_stack_fffffffffffffd78);
  this_01 = (statement_namespace *)local_119;
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x1b44b8
            );
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            (in_stack_fffffffffffffe00,
             (_Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
              *)in_stack_fffffffffffffdf8._M_pi,
             (_Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
              *)in_stack_fffffffffffffdf0,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  compiler_type::translate
            (in_stack_fffffffffffffd80,
             (deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)in_stack_fffffffffffffd78,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x1b44f0);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)block);
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x1b450c
            );
  local_138 = local_68;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffd78);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffd78);
  do {
    bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    if (!bVar1) {
      psVar4 = (statement_base *)statement_base::operator_new((size_t)in_stack_fffffffffffffd80);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::front(in_stack_fffffffffffffd90);
      pptVar5 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                          ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                           in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
      token_expr::get_tree((token_expr *)*pptVar5);
      tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd78);
      this_00 = (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                tree_type<cs::token_base_*>::iterator::data((iterator *)ptr_00);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      std::shared_ptr<cs::context_type>::shared_ptr
                ((shared_ptr<cs::context_type> *)&stack0xfffffffffffffdf0,
                 (shared_ptr<cs::context_type> *)in_stack_fffffffffffffd78);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               *)this_00);
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back(this_00);
      statement_namespace::statement_namespace(this_01,tbp,block,c,(token_base *)ptr_00);
      std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x1b4840);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque(block);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque(block);
      return psVar4;
    }
    local_180 = std::
                _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                ::operator*(&local_158);
    iVar2 = (*(*local_180)->_vptr_statement_base[2])();
    if (iVar2 != 2) {
      iVar2 = (*(*local_180)->_vptr_statement_base[2])();
      if (iVar2 != 4) {
        iVar2 = (*(*local_180)->_vptr_statement_base[2])();
        if (iVar2 != 7) {
          iVar2 = (*(*local_180)->_vptr_statement_base[2])();
          if (iVar2 != 0x17) {
            iVar2 = (*(*local_180)->_vptr_statement_base[2])();
            if (iVar2 != 6) {
              iVar2 = (*(*local_180)->_vptr_statement_base[2])();
              if (iVar2 != 0x16) {
                uVar3 = __cxa_allocate_exception(0x28);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_1a0,"Unexpected statement in namespace definition.",&local_1a1);
                compile_error::compile_error
                          ((compile_error *)in_stack_fffffffffffffd80,
                           (string *)in_stack_fffffffffffffd78);
                __cxa_throw(uVar3,&compile_error::typeinfo,compile_error::~compile_error);
              }
            }
          }
        }
      }
    }
    std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
    operator++((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                *)in_stack_fffffffffffffd80);
  } while( true );
}

Assistant:

statement_base *
	method_namespace::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		for (auto &ptr: body)
			if (ptr->get_type() != statement_types::import_ && ptr->get_type() != statement_types::involve_ &&
			        ptr->get_type() != statement_types::var_ && ptr->get_type() != statement_types::function_ &&
			        ptr->get_type() != statement_types::namespace_ && ptr->get_type() != statement_types::struct_)
				throw compile_error("Unexpected statement in namespace definition.");
		return new statement_namespace(static_cast<token_expr *>(raw.front().at(1))->get_tree().root().data(), body,
		                               context, raw.front().back());
	}